

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O1

void __thiscall duckdb::WindowTokenTreeLocalState::BuildLeaves(WindowTokenTreeLocalState *this)

{
  SBScanState *pSVar1;
  WindowTokenTree *pWVar2;
  pointer puVar3;
  int iVar4;
  type gss;
  ulong uVar5;
  type pSVar6;
  reference pvVar7;
  ulong uVar8;
  ulong uVar9;
  SBIterator prev;
  SBIterator curr;
  SBIterator local_200;
  SBIterator local_118;
  
  gss = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
        operator*(&(this->token_tree->super_WindowMergeSortTree).global_sort);
  if ((gss->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (gss->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SBIterator::SBIterator(&local_118,gss,COMPARE_LESSTHAN,0);
    SBIterator::SBIterator(&local_200,gss,COMPARE_LESSTHAN,0);
    uVar5 = (this->super_WindowMergeSortTreeLocalState).build_task;
    pWVar2 = this->token_tree;
    puVar3 = (pWVar2->super_WindowMergeSortTree).block_starts.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(pWVar2->super_WindowMergeSortTree).block_starts.
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
    if (uVar8 <= uVar5) {
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    if (uVar8 <= uVar5 + 1) {
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                 uVar5 + 1);
    }
    uVar8 = puVar3[uVar5 + 1];
    if (puVar3[uVar5] == 0) {
      pvVar7 = vector<unsigned_char,_true>::operator[](&pWVar2->deltas,0);
      *pvVar7 = '\0';
    }
    else {
      uVar9 = puVar3[uVar5] - 1;
      uVar5 = uVar9 / local_118.block_capacity;
      if (uVar5 != local_118.scan.block_idx) {
        pSVar1 = &local_118.scan;
        SBScanState::SetIndices(pSVar1,uVar5,0);
        if (uVar5 < local_118.block_count) {
          SBScanState::PinRadix(pSVar1,local_118.scan.block_idx);
          local_118.block_ptr = SBScanState::RadixPtr(pSVar1);
          if (local_118.all_constant == false) {
            pSVar6 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                     operator*(&(local_118.scan.sb)->blob_sorting_data);
            SBScanState::PinData(pSVar1,pSVar6);
          }
        }
      }
      local_118.scan.entry_idx = uVar9 % local_118.block_capacity;
      local_118.entry_ptr = local_118.block_ptr + local_118.scan.entry_idx * local_118.entry_size;
      uVar5 = uVar9 / local_200.block_capacity;
      local_118.entry_idx = uVar9;
      if (uVar5 != local_200.scan.block_idx) {
        pSVar1 = &local_200.scan;
        SBScanState::SetIndices(pSVar1,uVar5,0);
        if (uVar5 < local_200.block_count) {
          SBScanState::PinRadix(pSVar1,local_200.scan.block_idx);
          local_200.block_ptr = SBScanState::RadixPtr(pSVar1);
          if (local_200.all_constant == false) {
            pSVar6 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                     operator*(&(local_200.scan.sb)->blob_sorting_data);
            SBScanState::PinData(pSVar1,pSVar6);
          }
        }
      }
      local_200.scan.entry_idx = uVar9 % local_200.block_capacity;
      local_200.entry_ptr = local_200.block_ptr + local_200.scan.entry_idx * local_200.entry_size;
      local_200.entry_idx = uVar9;
    }
    SBIterator::operator++(&local_118);
    while (local_118.entry_idx < uVar8) {
      if ((gss->sort_layout).all_constant == true) {
        iVar4 = FastMemcmp(local_200.entry_ptr,local_118.entry_ptr,
                           (gss->sort_layout).comparison_size);
      }
      else {
        iVar4 = Comparators::CompareTuple
                          (&local_200.scan,&local_118.scan,&local_200.entry_ptr,&local_118.entry_ptr
                           ,&gss->sort_layout,&local_200.external);
      }
      pvVar7 = vector<unsigned_char,_true>::operator[](&pWVar2->deltas,local_118.entry_idx);
      *pvVar7 = iVar4 != 0;
      SBIterator::operator++(&local_118);
      SBIterator::operator++(&local_200);
    }
    BufferHandle::~BufferHandle(&local_200.scan.payload_heap_handle);
    BufferHandle::~BufferHandle(&local_200.scan.payload_data_handle);
    BufferHandle::~BufferHandle(&local_200.scan.blob_sorting_heap_handle);
    BufferHandle::~BufferHandle(&local_200.scan.blob_sorting_data_handle);
    BufferHandle::~BufferHandle(&local_200.scan.radix_handle);
    BufferHandle::~BufferHandle(&local_118.scan.payload_heap_handle);
    BufferHandle::~BufferHandle(&local_118.scan.payload_data_handle);
    BufferHandle::~BufferHandle(&local_118.scan.blob_sorting_heap_handle);
    BufferHandle::~BufferHandle(&local_118.scan.blob_sorting_data_handle);
    BufferHandle::~BufferHandle(&local_118.scan.radix_handle);
  }
  return;
}

Assistant:

void WindowTokenTreeLocalState::BuildLeaves() {
	auto &global_sort = *token_tree.global_sort;
	if (global_sort.sorted_blocks.empty()) {
		return;
	}

	//	Scan the sort keys and note deltas
	SBIterator curr(global_sort, ExpressionType::COMPARE_LESSTHAN);
	SBIterator prev(global_sort, ExpressionType::COMPARE_LESSTHAN);
	const auto &sort_layout = global_sort.sort_layout;

	const auto block_begin = token_tree.block_starts.at(build_task);
	const auto block_end = token_tree.block_starts.at(build_task + 1);
	auto &deltas = token_tree.deltas;
	if (!block_begin) {
		// First block, so set up initial delta
		deltas[0] = 0;
	} else {
		// Move to the to end of the previous block
		// so we can record the comparison result for the first row
		curr.SetIndex(block_begin - 1);
		prev.SetIndex(block_begin - 1);
	}

	for (++curr; curr.GetIndex() < block_end; ++curr, ++prev) {
		int lt = 0;
		if (sort_layout.all_constant) {
			lt = FastMemcmp(prev.entry_ptr, curr.entry_ptr, sort_layout.comparison_size);
		} else {
			lt = Comparators::CompareTuple(prev.scan, curr.scan, prev.entry_ptr, curr.entry_ptr, sort_layout,
			                               prev.external);
		}

		deltas[curr.GetIndex()] = (lt != 0);
	}
}